

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

void __thiscall ColorPrimariesDisplayP3::ColorPrimariesDisplayP3(ColorPrimariesDisplayP3 *this)

{
  long lVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_e2;
  allocator_type local_e1;
  vector<float,_std::allocator<float>_> local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  undefined8 local_94;
  undefined8 uStack_8c;
  float local_84;
  vector<float,_std::allocator<float>_> local_80;
  float local_68 [12];
  float local_38 [10];
  
  local_38[4] = 0.69173855;
  local_38[5] = 0.07928691;
  local_38[6] = 0.0;
  local_38[7] = 0.04511338;
  local_38[0] = 0.48657095;
  local_38[1] = 0.2656677;
  local_38[2] = 0.19821729;
  local_38[3] = 0.22897457;
  local_38[8] = 1.0439441;
  __l._M_len = 9;
  __l._M_array = local_38;
  std::vector<float,_std::allocator<float>_>::vector(&local_e0,__l,&local_e1);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&uStack_9c + lVar1) =
         *(undefined4 *)
          ((long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1 + 8);
    *(undefined8 *)((long)&local_a4 + lVar1) =
         *(undefined8 *)
          ((long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1);
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x24);
  local_68[4] = 1.7626641;
  local_68[5] = 0.023624687;
  local_68[6] = 0.03584583;
  local_68[7] = -0.07617239;
  local_68[0] = 2.493497;
  local_68[1] = -0.9313836;
  local_68[2] = -0.4027108;
  local_68[3] = -0.829489;
  local_68[8] = 0.9568845;
  __l_00._M_len = 9;
  __l_00._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector(&local_80,__l_00,&local_e2);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&uStack_c0 + lVar1) =
         *(undefined4 *)
          ((long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1 + 8);
    *(undefined8 *)((long)&local_c8 + lVar1) =
         *(undefined8 *)
          ((long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar1);
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x24);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_84;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_94;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = uStack_8c;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_a4;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = uStack_9c;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_c8;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = uStack_c0;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_b8;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = uStack_b0;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_a8;
  operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ColorPrimariesDisplayP3() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.4865709486f, +0.2656676932f, +0.1982172852f,
            +0.2289745641f, +0.6917385218f, +0.0792869141f,
             0.0000000000f, +0.0451133819f, +1.0439441689f
        }),
        ColorPrimaryTransform({
            +2.4934969119f, -0.9313836179f, -0.4027107845f,
            -0.8294889696f, +1.7626640603f, +0.0236246858f,
            +0.0358458302f, -0.0761723893f, +0.9568845240f
        })
    ) {}